

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O2

void __thiscall OpenMD::SelectionEvaluator::predefine(SelectionEvaluator *this,string *script)

{
  bool bVar1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  *this_00;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  local_b0;
  vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> statement;
  string variable;
  vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
  aatoken;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"#predefine",(allocator<char> *)&variable);
  bVar1 = SelectionCompiler::compile(&this->compiler,&local_b0.first,script);
  std::__cxx11::string::~string((string *)&local_b0);
  if (!bVar1) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&aatoken,
                   "predefined set compile error:",script);
    std::operator+(&variable,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&aatoken,
                   "\ncompile error:");
    SelectionCompiler::getErrorMessage_abi_cxx11_((string *)&statement,&this->compiler);
    std::operator+(&local_b0.first,&variable,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&statement);
    evalError(this,&local_b0.first);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&statement);
    std::__cxx11::string::~string((string *)&variable);
    std::__cxx11::string::~string((string *)&aatoken);
    return;
  }
  std::
  vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
  ::vector(&aatoken,&(this->compiler).aatokenCompiled);
  if ((long)aatoken.
            super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)aatoken.
            super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x18) {
    std::operator+(&local_b0.first,"predefinition does not have exactly 1 command:",script);
    evalError(this,&local_b0.first);
    std::__cxx11::string::~string((string *)&local_b0);
    goto LAB_0021cc9f;
  }
  std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::vector
            (&statement,
             aatoken.
             super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  if ((ulong)(((long)statement.super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)statement.super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>.
                    _M_impl.super__Vector_impl_data._M_start) / 0x18) < 3) {
    std::operator+(&local_b0.first,"bad predefinition length:",script);
    evalError(this,&local_b0.first);
LAB_0021cc8b:
    this_00 = &local_b0;
  }
  else {
    if (statement.super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>._M_impl.
        super__Vector_impl_data._M_start[1].tok != 1 &&
        (~statement.super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>._M_impl.
          super__Vector_impl_data._M_start[1].tok & 0x4400U) != 0) {
      std::operator+(&local_b0.first,"invalid variable name:",script);
      evalError(this,&local_b0.first);
      goto LAB_0021cc8b;
    }
    std::any_cast<std::__cxx11::string>
              (&variable,
               &statement.super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>._M_impl.
                super__Vector_impl_data._M_start[1].value);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_&,_true>
              (&local_b0,&variable,&statement);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::any>,std::_Select1st<std::pair<std::__cxx11::string_const,std::any>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::any>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::any>,std::_Select1st<std::pair<std::__cxx11::string_const,std::any>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>
                *)&this->variables,&local_b0);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
    ::~pair(&local_b0);
    this_00 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
               *)&variable;
  }
  std::__cxx11::string::~string((string *)this_00);
  std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::~vector(&statement);
LAB_0021cc9f:
  std::
  vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
  ::~vector(&aatoken);
  return;
}

Assistant:

void SelectionEvaluator::predefine(const std::string& script) {
    if (compiler.compile("#predefine", script)) {
      std::vector<std::vector<Token>> aatoken = compiler.getAatokenCompiled();
      if (aatoken.size() != 1) {
        evalError("predefinition does not have exactly 1 command:" + script);
        return;
      }
      std::vector<Token> statement = aatoken[0];
      if (statement.size() > 2) {
        int tok = statement[1].tok;
        if (tok == Token::identifier ||
            (tok & Token::predefinedset) == Token::predefinedset) {
          std::string variable = std::any_cast<std::string>(statement[1].value);
          variables.insert(VariablesType::value_type(variable, statement));

        } else {
          evalError("invalid variable name:" + script);
        }
      } else {
        evalError("bad predefinition length:" + script);
      }

    } else {
      evalError("predefined set compile error:" + script +
                "\ncompile error:" + compiler.getErrorMessage());
    }
  }